

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

void __thiscall
vkt::wsi::anon_unknown_0::NativeObjects::NativeObjects
          (NativeObjects *this,Context *context,Extensions *supportedExtensions,Type wsiType,
          Maybe<tcu::Vector<unsigned_int,_2>_> *initialWindowSize)

{
  int iVar1;
  undefined4 extraout_var;
  Display *pDVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  pDVar2 = (Display *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 8))
                     ((long *)CONCAT44(extraout_var,iVar1),wsiType);
  (this->display).super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.
  ptr = pDVar2;
  iVar1 = (*pDVar2->_vptr_Display[2])(pDVar2,initialWindowSize);
  (this->window).super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr
       = (Window *)CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

NativeObjects (Context&				context,
				   const Extensions&	supportedExtensions,
				   Type					wsiType,
				   const Maybe<UVec2>&	initialWindowSize = tcu::nothing<UVec2>())
		: display	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(), supportedExtensions, wsiType))
		, window	(createWindow(*display, initialWindowSize))
	{}